

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

void __thiscall Epanet::Project::writeMsgLog(Project *this)

{
  char cVar1;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->rptFile,local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    std::__cxx11::stringbuf::str((string *)&(this->network).field_0xaf8);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void Project::writeMsgLog()
    {
        if ( rptFile.is_open() )
        {
            rptFile << network.msgLog.str();
            network.msgLog.str("");
        }
    }